

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOUAmount.cpp
# Opt level: O1

IOUAmount jbcoin::mulRatio(IOUAmount *amt,uint32_t num,uint32_t den,bool roundUp)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  undefined7 in_register_00000009;
  pointer pnVar19;
  long lVar20;
  int iVar21;
  undefined4 in_register_00000034;
  anon_class_1_0_00000001 *this;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__return_storage_ptr__;
  difference_type __d_1;
  ulong uVar22;
  difference_type __d;
  bool bVar23;
  IOUAmount IVar24;
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  low;
  IOUAmount result;
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  uint128_t den128;
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  terminal local_b9;
  cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
  local_b8;
  int local_9c;
  IOUAmount local_98;
  ulong local_88;
  undefined4 local_7c;
  cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
  local_78;
  IOUAmount local_68;
  cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
  local_58;
  cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
  local_48;
  
  this = (anon_class_1_0_00000001 *)CONCAT44(in_register_00000034,num);
  local_7c = (undefined4)CONCAT71(in_register_00000009,roundUp);
  if (den == 0) {
    Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"division by zero");
  }
  if (mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::powerTable == '\0') {
    __return_storage_ptr__ =
         (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          *)&mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::powerTable;
    iVar21 = __cxa_guard_acquire();
    if (iVar21 != 0) {
      mulRatio::anon_class_1_0_00000001::operator()(__return_storage_ptr__,this);
      __cxa_atexit(std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::~vector,&mulRatio::powerTable,&__dso_handle);
      __cxa_guard_release(&mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::
                           powerTable);
    }
  }
  if (mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::fl64 == '\0') {
    mulRatio();
  }
  local_88 = amt->mantissa_;
  local_58.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._0_8_ = (ulong)den;
  local_58.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._8_8_ = 0;
  uVar16 = -local_88;
  if (0 < (long)local_88) {
    uVar16 = local_88;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar16;
  local_48.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data = (cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
             )(auVar3 * ZEXT416(num));
  local_b8.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._0_8_ = 0;
  local_b8.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._8_8_ = 0;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>>
            (&local_b8,&local_48,&local_58);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (ulong)local_58.
                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (ulong)local_b8.
                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data;
  uVar16 = SUB168(auVar4 * auVar9,0);
  local_78.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._0_8_ =
       (ulong)local_48.
              super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
              .m_data - uVar16;
  local_78.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._8_8_ =
       (local_48.
        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data._8_8_ -
       (local_58.
        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data._8_8_ *
        (ulong)local_b8.
               super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
               .m_data +
       SUB168(auVar4 * auVar9,8) +
       (ulong)local_58.
              super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
              .m_data *
       local_b8.
       super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
       .m_data._8_8_)) -
       (ulong)((ulong)local_48.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data < uVar16);
  iVar21 = amt->exponent_;
  if ((ulong)local_78.
             super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
             .m_data != 0 ||
      local_78.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._8_8_ != 0) {
    uVar16 = (long)mulRatio::powerTable.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)mulRatio::powerTable.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    pnVar19 = mulRatio::powerTable.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (uVar17 = uVar16, 0 < (long)uVar17) {
      uVar16 = uVar17 >> 1;
      uVar1 = *(ulong *)((long)&pnVar19[uVar16].m_backend.
                                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                .m_data + 8);
      if (uVar1 < local_b8.
                  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data._8_8_ ||
          uVar1 - local_b8.
                  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data._8_8_ <
          (ulong)((ulong)pnVar19[uVar16].m_backend.
                         super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                         .m_data <
                 (ulong)local_b8.
                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data)) {
        pnVar19 = pnVar19 + uVar16 + 1;
        uVar16 = ~uVar16 + uVar17;
      }
    }
    iVar18 = (int)((ulong)((long)pnVar19 -
                          (long)mulRatio::powerTable.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
    uVar15 = mulRatio::fl64 - iVar18;
    if (uVar15 != 0 && iVar18 <= mulRatio::fl64) {
      iVar21 = iVar21 - uVar15;
      uVar16 = (ulong)mulRatio::powerTable.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data;
      lVar20 = *(long *)((long)&mulRatio::powerTable.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.
                                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                .m_data + 8) *
               (ulong)local_b8.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar16;
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           (ulong)local_b8.
                  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
      local_b8.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._0_8_ = SUB168(auVar5 * auVar10,0);
      local_b8.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._8_8_ =
           SUB168(auVar5 * auVar10,8) +
           local_b8.
           super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
           .m_data._8_8_ * uVar16 + lVar20;
      uVar16 = (ulong)mulRatio::powerTable.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data;
      lVar20 = *(long *)((long)&mulRatio::powerTable.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.
                                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                .m_data + 8) *
               (ulong)local_78.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar16;
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           (ulong)local_78.
                  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
      local_78.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._0_8_ = SUB168(auVar6 * auVar11,0);
      local_78.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._8_8_ =
           SUB168(auVar6 * auVar11,8) +
           local_78.
           super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
           .m_data._8_8_ * uVar16 + lVar20;
    }
    local_98.mantissa_ = 0;
    local_98._8_8_ = 0;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>>
              ((cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
                *)&local_98,&local_78,&local_58);
    bVar23 = CARRY8((ulong)local_b8.
                           super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                           .m_data,local_98.mantissa_);
    local_b8.
    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
    .m_data._0_8_ =
         local_98.mantissa_ +
         (ulong)local_b8.
                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data;
    local_b8.
    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
    .m_data._8_8_ =
         local_b8.
         super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
         .m_data._8_8_ + local_98._8_8_ + (ulong)bVar23;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (ulong)local_58.
                          super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                          .m_data;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_98.mantissa_;
    uVar16 = SUB168(auVar7 * auVar12,0);
    bVar23 = (ulong)local_78.
                    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data < uVar16;
    local_78.
    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
    .m_data._0_8_ =
         (ulong)local_78.
                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data - uVar16;
    local_78.
    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
    .m_data._8_8_ =
         (local_78.
          super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data._8_8_ -
         (local_98.mantissa_ *
          local_58.
          super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data._8_8_ +
         SUB168(auVar7 * auVar12,8) +
         local_98._8_8_ *
         (ulong)local_58.
                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data)) - (ulong)bVar23;
  }
  lVar20 = local_78.
           super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
           .m_data._8_8_;
  uVar1 = (ulong)local_78.
                 super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                 .m_data;
  uVar17 = local_b8.
           super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
           .m_data._8_8_;
  uVar16 = (ulong)local_b8.
                  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
  bVar23 = (ulong)local_78.
                  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data != 0 ||
           local_78.
           super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
           .m_data._8_8_ != 0;
  uVar22 = (long)mulRatio::powerTable.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)mulRatio::powerTable.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  pnVar19 = mulRatio::powerTable.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (uVar14 = uVar22, 0 < (long)uVar14) {
    uVar22 = uVar14 >> 1;
    uVar2 = *(ulong *)((long)&pnVar19[uVar22].m_backend.
                              super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                              .m_data + 8);
    if (uVar2 < local_b8.
                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data._8_8_ ||
        uVar2 - local_b8.
                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data._8_8_ <
        (ulong)((ulong)pnVar19[uVar22].m_backend.
                       super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                       .m_data <
               (ulong)local_b8.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data)) {
      pnVar19 = pnVar19 + uVar22 + 1;
      uVar22 = ~uVar22 + uVar14;
    }
  }
  iVar18 = (int)((ulong)((long)pnVar19 -
                        (long)mulRatio::powerTable.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
  uVar15 = iVar18 - mulRatio::fl64;
  if (uVar15 != 0 && mulRatio::fl64 <= iVar18) {
    local_9c = iVar21 + uVar15;
    local_98.mantissa_ =
         (int64_t)(mulRatio::powerTable.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar15);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
    ::
    do_divide<boost::multiprecision::detail::expression<boost::multiprecision::detail::terminal,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>,void,void,void>>
              ((number<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
                *)&local_b8,
               (expression<boost::multiprecision::detail::terminal,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_void,_void,_void>
                *)&local_98,&local_b9);
    iVar21 = local_9c;
    if (uVar1 == 0 && lVar20 == 0) {
      uVar1 = (ulong)mulRatio::powerTable.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.
                     super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                     .m_data;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar1;
      auVar13._8_8_ = 0;
      auVar13._0_8_ =
           (ulong)local_b8.
                  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
      uVar22 = SUB168(auVar8 * auVar13,0);
      bVar23 = uVar17 - (uVar1 * local_b8.
                                 super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                 .m_data._8_8_ + SUB168(auVar8 * auVar13,8) +
                        *(long *)((long)&mulRatio::powerTable.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend
                                         .
                                         super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                         .m_data + 8) *
                        (ulong)local_b8.
                               super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                               .m_data) != (ulong)(uVar16 < uVar22) || uVar16 != uVar22;
    }
  }
  uVar16 = local_88;
  uVar17 = (ulong)local_b8.
                  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
  if (0x7ffffffffffffffe <
      (ulong)local_b8.
             super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
             .m_data) {
    uVar17 = 0x7fffffffffffffff;
  }
  if (local_b8.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._8_8_ != 0) {
    uVar17 = 0x7fffffffffffffff;
  }
  local_98.mantissa_ = -uVar17;
  if (-1 < (long)local_88) {
    local_98.mantissa_ = uVar17;
  }
  local_98.exponent_ = iVar21;
  IOUAmount::normalize(&local_98);
  if (!bVar23) {
LAB_001bdd4b:
    local_68.mantissa_ = local_98.mantissa_;
    local_68.exponent_ = local_98.exponent_;
    goto LAB_001bdd9f;
  }
  if ((char)local_7c == '\x01' && -1 < (long)uVar16) {
    if (local_98.mantissa_ == 0) {
      local_68.mantissa_ = 1000000000000000;
      goto LAB_001bdd8b;
    }
    local_68.mantissa_ = local_98.mantissa_ + 1;
LAB_001bdd64:
    local_68.exponent_ = local_98.exponent_;
  }
  else {
    if (-1 < (long)uVar16 || (char)local_7c != '\0') goto LAB_001bdd4b;
    if (local_98.mantissa_ != 0) {
      local_68.mantissa_ = local_98.mantissa_ - 1;
      goto LAB_001bdd64;
    }
    local_68.mantissa_ = 0xfffc72815b398000;
LAB_001bdd8b:
    local_68.exponent_ = -0x60;
  }
  IOUAmount::normalize(&local_68);
LAB_001bdd9f:
  IVar24.exponent_ = local_68.exponent_;
  IVar24.mantissa_ = local_68.mantissa_;
  IVar24._12_4_ = 0;
  return IVar24;
}

Assistant:

IOUAmount
mulRatio (
    IOUAmount const& amt,
    std::uint32_t num,
    std::uint32_t den,
    bool roundUp)
{
    using namespace boost::multiprecision;

    if (!den)
        Throw<std::runtime_error> ("division by zero");

    // A vector with the value 10^index for indexes from 0 to 29
    // The largest intermediate value we expect is 2^96, which
    // is less than 10^29
    static auto const powerTable = []
    {
        std::vector<uint128_t> result;
        result.reserve (30);  // 2^96 is largest intermediate result size
        uint128_t cur (1);
        for (int i = 0; i < 30; ++i)
        {
            result.push_back (cur);
            cur *= 10;
        };
        return result;
    }();

    // Return floor(log10(v))
    // Note: Returns -1 for v == 0
    static auto log10Floor = [](uint128_t const& v)
    {
        // Find the index of the first element >= the requested element, the index
        // is the log of the element in the log table.
        auto const l = std::lower_bound (powerTable.begin (), powerTable.end (), v);
        int index = std::distance (powerTable.begin (), l);
        // If we're not equal, subtract to get the floor
        if (*l != v)
            --index;
        return index;
    };

    // Return ceil(log10(v))
    static auto log10Ceil = [](uint128_t const& v)
    {
        // Find the index of the first element >= the requested element, the index
        // is the log of the element in the log table.
        auto const l = std::lower_bound (powerTable.begin (), powerTable.end (), v);
        return int(std::distance (powerTable.begin (), l));
    };

    static auto const fl64 =
        log10Floor (std::numeric_limits<std::int64_t>::max ());

    bool const neg = amt.mantissa () < 0;
    uint128_t const den128 (den);
    // a 32 value * a 64 bit value and stored in a 128 bit value. This will never overflow
    uint128_t const mul =
        uint128_t (neg ? -amt.mantissa () : amt.mantissa ()) * uint128_t (num);

    auto low = mul / den128;
    uint128_t rem (mul - low * den128);

    int exponent = amt.exponent ();

    if (rem)
    {
        // Mathematically, the result is low + rem/den128. However, since this
        // uses integer division rem/den128 will be zero. Scale the result so
        // low does not overflow the largest amount we can store in the mantissa
        // and (rem/den128) is as large as possible. Scale by multiplying low
        // and rem by 10 and subtracting one from the exponent. We could do this
        // with a loop, but it's more efficient to use logarithms.
        auto const roomToGrow = fl64 - log10Ceil (low);
        if (roomToGrow > 0)
        {
            exponent -= roomToGrow;
            low *= powerTable[roomToGrow];
            rem *= powerTable[roomToGrow];
        }
        auto const addRem = rem / den128;
        low += addRem;
        rem = rem - addRem * den128;
    }

    // The largest result we can have is ~2^95, which overflows the 64 bit
    // result we can store in the mantissa. Scale result down by dividing by ten
    // and adding one to the exponent until the low will fit in the 64-bit
    // mantissa. Use logarithms to avoid looping.
    bool hasRem = bool(rem);
    auto const mustShrink = log10Ceil (low) - fl64;
    if (mustShrink > 0)
    {
        uint128_t const sav (low);
        exponent += mustShrink;
        low /= powerTable[mustShrink];
        if (!hasRem)
            hasRem = bool(sav - low * powerTable[mustShrink]);
    }

    std::int64_t mantissa = low.convert_to<std::int64_t> ();

    // normalize before rounding
    if (neg)
        mantissa *= -1;

    IOUAmount result (mantissa, exponent);

    if (hasRem)
    {
        // handle rounding
        if (roundUp && !neg)
        {
            if (!result)
            {
                return IOUAmount (minMantissa, minExponent);
            }
            // This addition cannot overflow because the mantissa is already normalized
            return IOUAmount (result.mantissa () + 1, result.exponent ());
        }

        if (!roundUp && neg)
        {
            if (!result)
            {
                return IOUAmount (-minMantissa, minExponent);
            }
            // This subtraction cannot underflow because `result` is not zero
            return IOUAmount (result.mantissa () - 1, result.exponent ());
        }
    }

    return result;
}